

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_dialer_dial(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_err result;
  nni_ws *pnStack_28;
  int rv;
  nni_ws *ws;
  nni_ws_dialer *d;
  nni_aio *aio_local;
  void *arg_local;
  
  ws = (nni_ws *)arg;
  d = (nni_ws_dialer *)aio;
  aio_local = (nni_aio *)arg;
  nni_aio_reset(aio);
  result = ws_init(&stack0xffffffffffffffd8);
  if (result == NNG_OK) {
    nni_mtx_lock((nni_mtx *)&ws->recv_text);
    if (((ws->rxq).ll_offset & 1) == 0) {
      _Var1 = nni_aio_start((nni_aio *)d,ws_dial_cancel,pnStack_28);
      if (_Var1) {
        pnStack_28->dialer = (nni_ws_dialer *)ws;
        pnStack_28->useraio = (nni_aio *)d;
        pnStack_28->server = false;
        pnStack_28->maxframe = (ws->txaio).a_expire;
        pnStack_28->isstream = (_Bool)(*(byte *)((long)&(ws->rxq).ll_offset + 1) & 1);
        pnStack_28->recv_text = (_Bool)(*(byte *)((long)&(ws->rxq).ll_offset + 3) & 1);
        pnStack_28->send_text = (_Bool)(*(byte *)((long)&(ws->rxq).ll_offset + 2) & 1);
        nni_list_append((nni_list *)&(ws->txq).ll_offset,pnStack_28);
        nni_http_client_connect(*(nni_http_client **)&ws->server,&pnStack_28->connaio);
        nni_mtx_unlock((nni_mtx *)&ws->recv_text);
      }
      else {
        nni_mtx_unlock((nni_mtx *)&ws->recv_text);
        ws_reap(pnStack_28);
      }
    }
    else {
      nni_mtx_unlock((nni_mtx *)&ws->recv_text);
      nni_aio_finish_error((nni_aio *)d,NNG_ECLOSED);
      ws_reap(pnStack_28);
    }
  }
  else {
    nni_aio_finish_error((nni_aio *)d,result);
  }
  return;
}

Assistant:

static void
ws_dialer_dial(void *arg, nni_aio *aio)
{
	nni_ws_dialer *d = arg;
	nni_ws        *ws;
	int            rv;

	nni_aio_reset(aio);
	if ((rv = ws_init(&ws)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_mtx_lock(&d->mtx);
	if (d->closed) {
		nni_mtx_unlock(&d->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		ws_reap(ws);
		return;
	}
	if (!nni_aio_start(aio, ws_dial_cancel, ws)) {
		nni_mtx_unlock(&d->mtx);
		ws_reap(ws);
		return;
	}
	ws->dialer    = d;
	ws->useraio   = aio;
	ws->server    = false;
	ws->maxframe  = d->maxframe;
	ws->isstream  = d->isstream;
	ws->recv_text = d->recv_text;
	ws->send_text = d->send_text;
	nni_list_append(&d->wspend, ws);
	nni_http_client_connect(d->client, &ws->connaio);
	nni_mtx_unlock(&d->mtx);
}